

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O3

Pubkey * cfd::core::SchnorrUtil::ComputeSigPoint
                   (Pubkey *__return_storage_ptr__,ByteData256 *msg,SchnorrPubkey *nonce,
                   SchnorrPubkey *pubkey)

{
  int iVar1;
  undefined8 uVar2;
  CfdException *this;
  secp256k1_pubkey_conflict secp_sigpoint;
  secp256k1_xonly_pubkey secp_nonce;
  secp256k1_xonly_pubkey xonly_pubkey;
  string local_110;
  secp256k1_pubkey_conflict local_f0;
  secp256k1_xonly_pubkey local_b0;
  secp256k1_xonly_pubkey local_70;
  
  uVar2 = wally_get_secp_context();
  ParseXOnlyPubkey(&local_70,pubkey);
  ParseXOnlyPubkey(&local_b0,nonce);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110,msg);
  iVar1 = secp256k1_schnorrsig_compute_sigpoint
                    (uVar2,&local_f0,local_110._M_dataplus._M_p,&local_b0,&local_70);
  if (local_110._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (iVar1 == 1) {
    ConvertSecpPubkey(__return_storage_ptr__,&local_f0);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"Could not compute sigpoint","");
  CfdException::CfdException(this,kCfdInternalError,&local_110);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPoint(
    const ByteData256 &msg, const SchnorrPubkey &nonce,
    const SchnorrPubkey &pubkey) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey = ParseXOnlyPubkey(pubkey);

  secp256k1_xonly_pubkey secp_nonce = ParseXOnlyPubkey(nonce);

  secp256k1_pubkey secp_sigpoint;

  auto ret = secp256k1_schnorrsig_compute_sigpoint(
      ctx, &secp_sigpoint, msg.GetBytes().data(), &secp_nonce, &xonly_pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not compute sigpoint");
  }

  return ConvertSecpPubkey(secp_sigpoint);
}